

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::_makeConcrete(TranslateToFuzzReader *this,Type type)

{
  WeightedOption weightedOption;
  WeightedOption weightedOption_00;
  WeightedOption weightedOption_01;
  WeightedOption weightedOption_02;
  WeightedOption rest;
  WeightedOption rest_00;
  WeightedOption rest_01;
  WeightedOption rest_1;
  WeightedOption rest_1_00;
  WeightedOption rest_2;
  WeightedOption rest_2_00;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar1;
  HeapType HVar2;
  iterator iVar3;
  iterator iVar4;
  code *pcVar5;
  Expression *pEVar6;
  long extraout_RDX;
  long *plVar7;
  FeatureSet feature;
  byte bVar8;
  byte bVar9;
  undefined1 local_68 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  Type type_local;
  
  bVar9 = (byte)type.id & 6 < type.id;
  bVar8 = 1;
  if (bVar9 == 1) {
    bVar8 = (*(byte *)((long)&(this->wasm->features).features + 1) & 2) >> 1;
  }
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&options;
  options.options._M_t._M_impl._0_4_ = 0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  weightedOption.weight = 4;
  weightedOption._0_16_ = ZEXT816(0x151e74);
  rest.weight = 4;
  rest._0_16_ = ZEXT816(0x151fa8);
  rest_1.weight = 2;
  rest_1._0_16_ = ZEXT816(0x152bd8);
  rest_2.weight = 2;
  rest_2._0_16_ = ZEXT816(0x14e746);
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  options.options._M_t._M_impl.super__Rb_tree_header._M_node_count = type.id;
  Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption>
            ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
             local_68,(FeatureSet)0x0,weightedOption,rest,rest_1,rest_2);
  if (bVar8 != 0) {
    weightedOption_00.weight = 2;
    weightedOption_00._0_16_ = ZEXT816(0x151100);
    rest_00.weight = 2;
    rest_00._0_16_ = ZEXT816(0x152c88);
    rest_1_00.weight = 2;
    rest_1_00._0_16_ = ZEXT816(0x152d6e);
    rest_2_00.weight = 2;
    rest_2_00._0_16_ = ZEXT816(0x152ee4);
    pFVar1 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)local_68,(FeatureSet)0x0,weightedOption_00,rest_00,rest_1_00,rest_2_00,
                        0x153102,0);
    pFVar1 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar1,(FeatureSet)0x40,0x15359c);
    pFVar1 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar1,(FeatureSet)0x40,0x153820);
    pFVar1 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar1,(FeatureSet)0x500,0x153b7a);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar1,(FeatureSet)0x500,0x153d30);
  }
  if ((1 < type.id) && ((6 < type.id & (byte)type.id) == 0)) {
    weightedOption_01.weight = 2;
    weightedOption_01._0_16_ = ZEXT816(0x15404c);
    rest_01.weight = 2;
    rest_01._0_16_ = ZEXT816(0x15486a);
    pFVar1 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)local_68,(FeatureSet)0x0,weightedOption_01,rest_01,0x154de4);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar1,(FeatureSet)0x200,0x154e5a);
    if (type.id < 7 || (type.id & 1) != 0) {
      weightedOption_02.weight = 2;
      weightedOption_02._0_16_ = ZEXT816(0x15508e);
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x0,weightedOption_02);
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x8,0x155138);
    }
  }
  if ((type.id & 0xfffffffffffffffe) == 2) {
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_68,(FeatureSet)0x1,0x15524a);
    if (type.id == 2) {
      if ((this->callRefCatchImportName).super_IString.str._M_str != (char *)0x0 ||
          (this->callExportCatchImportName).super_IString.str._M_str != (char *)0x0) {
        Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
        add<>((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
              local_68,(FeatureSet)0x0,0x14ffba);
      }
      if ((this->sleepImportName).super_IString.str._M_str != (char *)0x0) {
        Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
        add<>((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
              local_68,(FeatureSet)0x0,0x150218);
      }
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x100,0x155528);
      Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
      add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x500,0x1555a8,0,0x155646);
      Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
      add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x4500,0x155840,0,0x1559d2,0);
    }
  }
  if (bVar9 != 0) {
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_68,(FeatureSet)0x200,0x155b7a);
    goto LAB_001525d2;
  }
  if ((type.id & 1) != 0 || type.id < 7) goto LAB_001525d2;
  HVar2 = Type::getHeapType((Type *)&options.options._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
  if (HVar2.id < 0x7d) {
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_68,(FeatureSet)0x500,0x14f5c4);
    if (((6 < options.options._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
        (((uint)options.options._M_t._M_impl.super__Rb_tree_header._M_node_count & 3) == 2)) &&
       (this->funcContext != (FunctionCreationContext *)0x0)) {
      pcVar5 = makeTableGet;
      if (HVar2.id == 0x48) {
        feature.features = 0x40;
      }
      else {
        if (HVar2.id != 0x10) goto LAB_001525bb;
        feature.features = 0x100;
      }
      goto LAB_001525b0;
    }
  }
  else {
    pcVar5 = makeCompoundRef;
    feature.features = 0x500;
LAB_001525b0:
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_68,feature,(offset_in_TranslateToFuzzReader_to_subr)pcVar5);
  }
LAB_001525bb:
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
            ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
             local_68,(FeatureSet)0x500,0x1561bc);
LAB_001525d2:
  if (((this->wasm->features).features & 0x400) != 0) {
    iVar3 = std::
            _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeStructFields)._M_h,
                   (key_type *)&options.options._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x500,0x156300);
    }
    iVar4 = std::
            _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeArrays)._M_h,
                   (key_type *)&options.options._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_68,(FeatureSet)0x500,0x1563b6);
    }
  }
  pcVar5 = (code *)_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                             (&this->random,
                              (FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                               *)local_68);
  plVar7 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)pcVar5 & 1) != 0) {
    pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
  }
  pEVar6 = (Expression *)
           (*pcVar5)(plVar7,options.options._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
               *)local_68);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::_makeConcrete(Type type) {
  bool canMakeControlFlow = !type.isTuple() || wasm.features.hasMultivalue();
  using Self = TranslateToFuzzReader;
  FeatureOptions<Expression* (Self::*)(Type)> options;
  using WeightedOption = decltype(options)::WeightedOption;
  options.add(FeatureSet::MVP,
              WeightedOption{&Self::makeLocalGet, VeryImportant},
              WeightedOption{&Self::makeLocalSet, VeryImportant},
              WeightedOption{&Self::makeGlobalGet, Important},
              WeightedOption{&Self::makeConst, Important});
  if (canMakeControlFlow) {
    options
      .add(FeatureSet::MVP,
           WeightedOption{&Self::makeBlock, Important},
           WeightedOption{&Self::makeIf, Important},
           WeightedOption{&Self::makeLoop, Important},
           WeightedOption{&Self::makeBreak, Important},
           &Self::makeCall,
           &Self::makeCallIndirect)
      .add(FeatureSet::ExceptionHandling, &Self::makeTry)
      .add(FeatureSet::ExceptionHandling, &Self::makeTryTable)
      .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeCallRef)
      .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeBrOn);
  }
  if (type.isSingle()) {
    options
      .add(FeatureSet::MVP,
           WeightedOption{&Self::makeUnary, Important},
           WeightedOption{&Self::makeBinary, Important},
           &Self::makeSelect)
      .add(FeatureSet::Multivalue, &Self::makeTupleExtract);
  }
  if (type.isSingle() && !type.isRef()) {
    options.add(FeatureSet::MVP, {&Self::makeLoad, Important});
    options.add(FeatureSet::SIMD, &Self::makeSIMD);
  }
  if (type.isInteger()) {
    options.add(FeatureSet::Atomics, &Self::makeAtomic);
  }
  if (type == Type::i32) {
    if (callExportCatchImportName || callRefCatchImportName) {
      options.add(FeatureSet::MVP, &Self::makeImportCallCode);
    }
    if (sleepImportName) {
      options.add(FeatureSet::MVP, &Self::makeImportSleep);
    }
    options.add(FeatureSet::ReferenceTypes, &Self::makeRefIsNull);
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                &Self::makeRefEq,
                &Self::makeRefTest,
                &Self::makeI31Get);
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC |
                  FeatureSet::Strings,
                &Self::makeStringEncode,
                &Self::makeStringEq,
                &Self::makeStringMeasure,
                &Self::makeStringGet);
  }
  if (type.isTuple()) {
    options.add(FeatureSet::Multivalue, &Self::makeTupleMake);
  }
  if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeBasicRef);
      if (type.isNullable() && funcContext) {
        if (heapType == HeapType::func) {
          options.add(FeatureSet::ReferenceTypes, &Self::makeTableGet);
        }
        if (heapType == HeapType::exn) {
          options.add(FeatureSet::ExceptionHandling, &Self::makeTableGet);
        }
      }
    } else {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeCompoundRef);
    }
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                &Self::makeRefCast);
  }
  if (wasm.features.hasGC()) {
    if (typeStructFields.find(type) != typeStructFields.end()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeStructGet);
    }
    if (typeArrays.find(type) != typeArrays.end()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeArrayGet);
    }
  }
  return (this->*pick(options))(type);
}